

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall
ikfast::IkSolution<double>::GetSolutionIndices
          (IkSolution<double> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  int *piVar1;
  byte bVar2;
  uint in_EAX;
  ulong uVar3;
  pointer pIVar4;
  size_t j_2;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t j_1;
  long lVar9;
  undefined8 local_38;
  
  local_38._0_4_ = in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,0);
  local_38 = (ulong)(uint)local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (v,(uint *)((long)&local_38 + 4));
  pIVar4 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_vbasesol).
                 super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4) / 0x18 & 0xffffffff;
  do {
    uVar3 = uVar7 & 0xffffffff;
    lVar8 = uVar7 * 0x18 + -6;
    while( true ) {
      uVar7 = uVar7 - 1;
      if ((int)uVar3 < 1) {
        return;
      }
      bVar2 = pIVar4->indices[lVar8 + -0x13];
      if ((1 < bVar2) && (bVar2 != 0xff)) break;
      uVar3 = (ulong)((int)uVar3 - 1);
      lVar8 = lVar8 + -0x18;
    }
    lVar9 = *(long *)v;
    lVar5 = *(long *)(v + 8) - lVar9 >> 2;
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      *(uint *)(lVar9 + lVar6 * 4) = *(int *)(lVar9 + lVar6 * 4) * (uint)bVar2;
    }
    if (pIVar4->indices[lVar8 + -0x11] != 0xff) {
      for (lVar9 = 0; lVar5 != lVar9; lVar9 = lVar9 + 1) {
        local_38 = CONCAT44(local_38._4_4_,
                            (uint)((this->_vbasesol).
                                   super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->indices
                                  [lVar8 + -0x11] + *(int *)(*(long *)v + lVar9 * 4));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (v,(uint *)&local_38);
      }
      pIVar4 = (this->_vbasesol).
               super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pIVar4->indices[lVar8 + -0x12] != 0xff) {
      lVar9 = *(long *)v;
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        piVar1 = (int *)(lVar9 + lVar6 * 4);
        *piVar1 = *piVar1 + (uint)pIVar4->indices[lVar8 + -0x12];
      }
    }
  } while( true );
}

Assistant:

virtual void GetSolutionIndices(std::vector<unsigned int>& v) const {
        v.resize(0);
        v.push_back(0);
        for(int i = (int)_vbasesol.size()-1; i >= 0; --i) {
            if( _vbasesol[i].maxsolutions != (unsigned char)-1 && _vbasesol[i].maxsolutions > 1 ) {
                for(size_t j = 0; j < v.size(); ++j) {
                    v[j] *= _vbasesol[i].maxsolutions;
                }
                size_t orgsize=v.size();
                if( _vbasesol[i].indices[1] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v.push_back(v[j]+_vbasesol[i].indices[1]);
                    }
                }
                if( _vbasesol[i].indices[0] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v[j] += _vbasesol[i].indices[0];
                    }
                }
            }
        }
    }